

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void __thiscall VmBlock::AddInstruction(VmBlock *this,VmInstruction *instruction)

{
  VmInstruction *pVVar1;
  VmInstruction *pVVar2;
  
  if (instruction == (VmInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7c2,"void VmBlock::AddInstruction(VmInstruction *)");
  }
  if (instruction->parent != (VmBlock *)0x0) {
    __assert_fail("instruction->parent == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7c3,"void VmBlock::AddInstruction(VmInstruction *)");
  }
  if (instruction->prevSibling != (VmInstruction *)0x0) {
    __assert_fail("instruction->prevSibling == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7c4,"void VmBlock::AddInstruction(VmInstruction *)");
  }
  if (instruction->nextSibling != (VmInstruction *)0x0) {
    __assert_fail("instruction->nextSibling == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7c5,"void VmBlock::AddInstruction(VmInstruction *)");
  }
  instruction->parent = this;
  pVVar1 = this->firstInstruction;
  pVVar2 = this->insertPoint;
  if (pVVar1 == (VmInstruction *)0x0) {
    if (pVVar2 != (VmInstruction *)0x0) {
      __assert_fail("!insertPoint",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x7cb,"void VmBlock::AddInstruction(VmInstruction *)");
    }
    this->lastInstruction = instruction;
    this->firstInstruction = instruction;
  }
  else {
    if (pVVar2 == (VmInstruction *)0x0) {
      instruction->nextSibling = pVVar1;
      pVVar1->prevSibling = instruction;
      this->firstInstruction = instruction;
      pVVar2 = instruction->prevSibling;
      if (pVVar2 == (VmInstruction *)0x0) goto LAB_00270406;
    }
    else {
      pVVar1 = pVVar2->nextSibling;
      if (pVVar1 != (VmInstruction *)0x0) {
        pVVar1->prevSibling = instruction;
      }
      instruction->nextSibling = pVVar1;
      pVVar2->nextSibling = instruction;
      instruction->prevSibling = pVVar2;
      if (pVVar2 == this->lastInstruction) {
        this->lastInstruction = instruction;
      }
    }
    if (pVVar2->parent != this) {
      __assert_fail("instruction->prevSibling->parent == this",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x7e8,"void VmBlock::AddInstruction(VmInstruction *)");
    }
  }
LAB_00270406:
  if ((instruction->nextSibling != (VmInstruction *)0x0) &&
     (instruction->nextSibling->parent != this)) {
    __assert_fail("instruction->nextSibling->parent == this",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7eb,"void VmBlock::AddInstruction(VmInstruction *)");
  }
  this->insertPoint = instruction;
  return;
}

Assistant:

void VmBlock::AddInstruction(VmInstruction* instruction)
{
	assert(instruction);
	assert(instruction->parent == NULL);
	assert(instruction->prevSibling == NULL);
	assert(instruction->nextSibling == NULL);

	instruction->parent = this;

	if(!firstInstruction)
	{
		assert(!insertPoint);

		firstInstruction = lastInstruction = instruction;
	}
	else if(!insertPoint)
	{
		instruction->nextSibling = firstInstruction;

		firstInstruction->prevSibling = instruction;

		firstInstruction = instruction;
	}
	else
	{
		assert(insertPoint);

		if(insertPoint->nextSibling)
			insertPoint->nextSibling->prevSibling = instruction;

		instruction->nextSibling = insertPoint->nextSibling;

		insertPoint->nextSibling = instruction;
		instruction->prevSibling = insertPoint;

		if(insertPoint == lastInstruction)
			lastInstruction = instruction;
	}

	if(instruction->prevSibling)
		assert(instruction->prevSibling->parent == this);

	if(instruction->nextSibling)
		assert(instruction->nextSibling->parent == this);

	insertPoint = instruction;
}